

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall Clasp::ClaspFacade::SolveStrategy::Async::doNotify(Async *this,Event event)

{
  __int_type _Var1;
  __sighandler_t p_Var2;
  __sighandler_t __handler;
  int in_ESI;
  int __sig;
  ClaspFacade **ppCVar3;
  SolveStrategy *in_RDI;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  __int_type in_stack_ffffffffffffffb4;
  ClaspFacade *local_20 [2];
  int local_c;
  
  ppCVar3 = &in_RDI[1].facade_;
  local_c = in_ESI;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
            );
  switch(local_c) {
  case 0:
    ppCVar3 = (ClaspFacade **)0x1;
    std::__atomic_base<unsigned_int>::operator=
              ((__atomic_base<unsigned_int> *)in_RDI,in_stack_ffffffffffffffb4);
    break;
  case 1:
    ppCVar3 = (ClaspFacade **)0xa;
    std::__atomic_base<unsigned_int>::operator=
              ((__atomic_base<unsigned_int> *)in_RDI,in_stack_ffffffffffffffb4);
    break;
  case 2:
    _Var1 = std::__atomic_base::operator_cast_to_unsigned_int((__atomic_base<unsigned_int> *)in_RDI)
    ;
    if (_Var1 != 2) goto LAB_0012b176;
    ppCVar3 = (ClaspFacade **)0x1;
    std::__atomic_base<unsigned_int>::operator=
              ((__atomic_base<unsigned_int> *)in_RDI,in_stack_ffffffffffffffb4);
    break;
  case 3:
    ppCVar3 = (ClaspFacade **)0x4;
    std::__atomic_base<unsigned_int>::operator=
              ((__atomic_base<unsigned_int> *)in_RDI,in_stack_ffffffffffffffb4);
  }
  std::unique_lock<std::mutex>::unlock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  std::condition_variable::notify_all();
  if (local_c == 1) {
    std::unique_lock<std::mutex>::lock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    while( true ) {
      __sig = (int)ppCVar3;
      _Var1 = std::__atomic_base::operator_cast_to_unsigned_int
                        ((__atomic_base<unsigned_int> *)in_RDI);
      in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 & 0xffffff;
      if (_Var1 != 1) {
        p_Var2 = signal(in_RDI,__sig,__handler);
        in_stack_ffffffffffffffb0 = (int)p_Var2;
        in_stack_ffffffffffffffb4 =
             CONCAT13(in_stack_ffffffffffffffb0 != 0,(int3)in_stack_ffffffffffffffb4) ^ 0xff000000;
      }
      if ((in_stack_ffffffffffffffb4 & 0x1000000) == 0) break;
      ppCVar3 = local_20;
      std::condition_variable::wait((unique_lock *)(in_RDI[1].error_.field_2._M_local_buf + 8));
    }
  }
LAB_0012b176:
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

virtual void doNotify(Event event) {
		mt::unique_lock<Clasp::mt::mutex> lock(mqMutex_);
		switch (event) {
			case event_attach: state_ = state_run;  break;
			case event_model : state_ = state_next; break;
			case event_resume: if (state_ == state_model) { state_ = state_run; break; } else { return; }
			case event_detach: state_ = state_done;  break;
		};
		lock.unlock(); // synchronize-with other threads but no need to notify under lock
		mqCond_.notify_all();
		if (event == event_model) {
			for (lock.lock(); state_ != state_run && !signal();) {
				mqCond_.wait(lock);
			}
		}
	}